

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.h
# Opt level: O1

RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> __thiscall
capnp::
makeRpcServer<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestProvisionId,capnproto_test::capnp::test::TestRecipientId,capnproto_test::capnp::test::TestThirdPartyCapId,capnproto_test::capnp::test::TestJoinResult>
          (capnp *this,
          VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>
          *network,Client *bootstrapInterface)

{
  undefined8 uVar1;
  Impl *extraout_RDX;
  Impl *extraout_RDX_00;
  Impl *extraout_RDX_01;
  Impl *pIVar2;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> RVar3;
  Maybe<capnp::Capability::Client> local_40;
  Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  local_28;
  
  local_40.ptr.isSet = true;
  local_40.ptr.field_1.value.hook.disposer = (bootstrapInterface->hook).disposer;
  local_40.ptr.field_1.value.hook.ptr = (bootstrapInterface->hook).ptr;
  (bootstrapInterface->hook).ptr = (ClientHook *)0x0;
  local_28.ptr.isSet = false;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId>::
  RpcSystem<capnproto_test::capnp::test::TestProvisionId,capnproto_test::capnp::test::TestRecipientId,capnproto_test::capnp::test::TestThirdPartyCapId,capnproto_test::capnp::test::TestJoinResult>
            ((RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> *)this,network,&local_40,
             &local_28);
  uVar1 = local_28.ptr.field_1._16_8_;
  pIVar2 = extraout_RDX;
  if ((local_28.ptr.isSet == true) && ((long *)local_28.ptr.field_1._16_8_ != (long *)0x0)) {
    local_28.ptr.field_1._16_8_ = (long *)0x0;
    (*(code *)**(undefined8 **)local_28.ptr.field_1._8_8_)
              (local_28.ptr.field_1._8_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
    pIVar2 = extraout_RDX_00;
  }
  uVar1 = local_40.ptr.field_1.value.hook.ptr;
  if ((local_40.ptr.isSet == true) && (local_40.ptr.field_1.value.hook.ptr != (ClientHook *)0x0)) {
    local_40.ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
    (**(local_40.ptr.field_1.value.hook.disposer)->_vptr_Disposer)
              (local_40.ptr.field_1.value.hook.disposer,
               ((ClientHook *)uVar1)->_vptr_ClientHook[-2] +
               (long)&((ClientHook *)uVar1)->_vptr_ClientHook);
    pIVar2 = extraout_RDX_01;
  }
  RVar3.super_RpcSystemBase.impl.ptr = pIVar2;
  RVar3.super_RpcSystemBase.impl.disposer = (Disposer *)this;
  return (RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId>)RVar3.super_RpcSystemBase.impl
  ;
}

Assistant:

RpcSystem<VatId> makeRpcServer(
    VatNetwork<VatId, ProvisionId, RecipientId, ThirdPartyCapId, JoinResult>& network,
    Capability::Client bootstrapInterface) {
  return RpcSystem<VatId>(network, kj::mv(bootstrapInterface));
}